

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.hh
# Opt level: O0

void __thiscall
OpenMesh::PropertyT<OpenMesh::VectorT<double,_3>_>::PropertyT
          (PropertyT<OpenMesh::VectorT<double,_3>_> *this,
          PropertyT<OpenMesh::VectorT<double,_3>_> *_rhs)

{
  PropertyT<OpenMesh::VectorT<double,_3>_> *_rhs_local;
  PropertyT<OpenMesh::VectorT<double,_3>_> *this_local;
  
  BaseProperty::BaseProperty(&this->super_BaseProperty,&_rhs->super_BaseProperty);
  (this->super_BaseProperty)._vptr_BaseProperty = (_func_int **)&PTR__PropertyT_003dd1d8;
  std::vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>::vector
            (&this->data_,&_rhs->data_);
  return;
}

Assistant:

PropertyT(const PropertyT & _rhs)
      : BaseProperty( _rhs ), data_( _rhs.data_ ) {}